

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::updateThresholdUbChange
          (HighsDomain *this,HighsInt col,double newbound,double val,double *threshold)

{
  double dVar1;
  double dVar2;
  double dVar3;
  initializer_list<double> __l;
  double local_20;
  double local_18;
  double local_10;
  
  dVar1 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if ((dVar1 != newbound) || (NAN(dVar1) || NAN(newbound))) {
    local_10 = ((this->mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    dVar2 = local_10;
    if ((this->mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[col] == kContinuous) {
      dVar3 = (newbound - dVar1) * 0.3;
      dVar2 = local_10 * 1000.0;
      if (local_10 * 1000.0 <= dVar3) {
        dVar2 = dVar3;
      }
    }
    local_18 = ABS(val) * ((newbound - dVar1) - dVar2);
    local_20 = *threshold;
    __l._M_len = 3;
    __l._M_array = &local_20;
    dVar1 = std::max<double>(__l);
    *threshold = dVar1;
  }
  return;
}

Assistant:

void HighsDomain::updateThresholdUbChange(HighsInt col, double newbound,
                                          double val, double& threshold) {
  if (newbound != col_lower_[col]) {
    double thresholdNew =
        std::fabs(val) * boundRange(newbound, col_lower_[col],
                                    mipsolver->mipdata_->feastol,
                                    variableType(col));

    // the new threshold is now the maximum of the new threshold and the current
    // one
    threshold =
        std::max({threshold, thresholdNew, mipsolver->mipdata_->feastol});
  }
}